

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

void FAudioFXReverb_Free(void *fapo)

{
  undefined8 uVar1;
  DspReverb *in_RDI;
  FAudioFXReverb *reverb;
  FAudioFreeFunc in_stack_ffffffffffffffe8;
  DspReverb *pDVar2;
  
  pDVar2 = in_RDI;
  DspReverb_Destroy(in_RDI,in_stack_ffffffffffffffe8);
  uVar1._0_4_ = pDVar2->channel[0].lpf_comb[0].low_shelving.a0;
  uVar1._4_4_ = pDVar2->channel[0].lpf_comb[0].low_shelving.a1;
  (**(code **)&pDVar2->channel[0].lpf_comb[0].high_shelving.a2)(uVar1);
  (**(code **)&pDVar2->channel[0].lpf_comb[0].high_shelving.a2)(in_RDI);
  return;
}

Assistant:

void FAudioFXReverb_Free(void* fapo)
{
	FAudioFXReverb *reverb = (FAudioFXReverb*) fapo;
	DspReverb_Destroy(&reverb->reverb, reverb->base.pFree);
	reverb->base.pFree(reverb->base.m_pParameterBlocks);
	reverb->base.pFree(fapo);
}